

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

void Gia_ManIncrSimStart(Gia_Man_t *p,int nWords,int nObjs)

{
  Vec_Int_t *pVVar1;
  Vec_Wrd_t *pVVar2;
  int nObjs_local;
  int nWords_local;
  Gia_Man_t *p_local;
  
  if (p->fIncrSim == 0) {
    p->fIncrSim = 1;
    p->iPatsPi = 0;
    p->nSimWords = nWords;
    p->iTimeStamp = 1;
    pVVar1 = Vec_IntAlloc(p->nSimWords);
    p->vTimeStamps = pVVar1;
    p->iNextPi = 0;
    pVVar2 = Vec_WrdAlloc(p->nSimWords * nObjs);
    p->vSims = pVVar2;
    Gia_ManRandomW(1);
    return;
  }
  __assert_fail("!p->fIncrSim",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                ,0x480,"void Gia_ManIncrSimStart(Gia_Man_t *, int, int)");
}

Assistant:

void Gia_ManIncrSimStart( Gia_Man_t * p, int nWords, int nObjs )
{
    assert( !p->fIncrSim );
    p->fIncrSim  = 1;
    p->iPatsPi   = 0;
    p->nSimWords = nWords;
    // init time stamps
    p->iTimeStamp  = 1;
    p->vTimeStamps = Vec_IntAlloc( p->nSimWords );
    // init object sim info
    p->iNextPi = 0;       
    p->vSims   = Vec_WrdAlloc( p->nSimWords * nObjs );
    Gia_ManRandomW( 1 );
}